

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.c
# Opt level: O3

int lws_chunked_html_process(lws_process_html_args *args,lws_process_html_state *s)

{
  char cVar1;
  char **ppcVar2;
  int iVar3;
  uint uVar4;
  char *pcVar5;
  size_t sVar6;
  long lVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  char *pcVar11;
  int iVar12;
  int iVar13;
  long lVar14;
  char buffer [32];
  ulong local_80;
  char local_58 [40];
  
  pcVar11 = args->p;
  local_80 = (ulong)args->len;
  args->len = 0;
  s->start = pcVar11;
  if (0 < (long)local_80) {
    pcVar5 = pcVar11 + local_80;
    do {
      iVar8 = args->len + 7;
      iVar13 = (int)pcVar11 - (int)local_80;
      while( true ) {
        iVar13 = iVar13 + 1;
        if (args->max_len <= iVar8) {
          _lws_log(1,"Used up interpret padding\n");
          return -1;
        }
        iVar12 = s->pos;
        if ((long)iVar12 != 0) goto LAB_00121771;
        if (*pcVar11 == '$') break;
        args->len = iVar8 + -6;
        pcVar11 = pcVar11 + 1;
        iVar8 = iVar8 + 1;
        if (pcVar5 <= pcVar11) goto LAB_00121915;
      }
      s->start = pcVar11;
LAB_00121771:
      cVar1 = *pcVar11;
      s->pos = iVar12 + 1;
      s->swallow[iVar12] = cVar1;
      uVar4 = s->pos;
      if (((ulong)uVar4 == 0xf) || (iVar8 = s->count_vars, (long)iVar8 < 1)) {
LAB_0012186c:
        s->swallow[(int)uVar4] = '\0';
        memcpy(s->start,s->swallow,(ulong)(uint)s->pos);
        args->len = args->len + 1;
        s->pos = 0;
        pcVar11 = s->start;
      }
      else {
        ppcVar2 = s->vars;
        uVar9 = 0;
        uVar10 = 0;
        iVar12 = 0;
        do {
          iVar3 = strncmp(s->swallow,ppcVar2[uVar9],(ulong)uVar4);
          if (iVar3 == 0) {
            uVar10 = uVar9 & 0xffffffff;
          }
          iVar12 = iVar12 + (uint)(iVar3 == 0);
          uVar9 = uVar9 + 1;
        } while ((long)iVar8 != uVar9);
        if (iVar12 == 0) goto LAB_0012186c;
        if (iVar12 == 1) {
          sVar6 = strlen(s->vars[(int)uVar10]);
          if (uVar4 == (uint)sVar6) {
            pcVar11 = (*s->replace)(s->data,(int)uVar10);
            if (pcVar11 == (char *)0x0) {
              pcVar11 = "NULL";
            }
            sVar6 = strlen(pcVar11);
            s->swallow[s->pos] = '\0';
            iVar8 = (int)sVar6;
            if (s->pos != iVar8) {
              memmove(s->start + iVar8,s->start + s->pos,(ulong)(uint)(*(int *)&args->p - iVar13));
              local_80 = (ulong)((((int)local_80 + iVar8) - s->pos) + 1);
            }
            memcpy(s->start,pcVar11,sVar6 & 0xffffffff);
            args->len = args->len + 1;
            pcVar11 = s->start + 1;
            s->pos = 0;
          }
        }
      }
      pcVar11 = pcVar11 + 1;
      pcVar5 = args->p + (int)local_80;
    } while (pcVar11 < pcVar5);
  }
LAB_00121915:
  if (args->chunked == 0) {
    iVar8 = 0;
  }
  else if ((args->final == 0) || (iVar8 = -1, args->len + 7 < args->max_len)) {
    iVar8 = 0;
    uVar4 = sprintf(local_58,"%X\r\n");
    pcVar11 = args->p;
    lVar14 = (long)(int)uVar4;
    args->p = pcVar11 + -lVar14;
    memcpy(pcVar11 + -lVar14,local_58,(ulong)uVar4);
    iVar13 = args->len;
    lVar7 = iVar13 + lVar14;
    args->len = (int)lVar7;
    iVar12 = args->final;
    pcVar11 = args->p;
    pcVar11[lVar7] = '\r';
    if (iVar12 == 0) {
      pcVar11[lVar7 + 1] = '\n';
      args->len = args->len + 2;
    }
    else {
      builtin_strncpy(pcVar11 + iVar13 + lVar14 + 1,"\n0\r\n\r\n",6);
      args->len = args->len + 7;
    }
  }
  return iVar8;
}

Assistant:

int
lws_chunked_html_process(struct lws_process_html_args *args,
			 struct lws_process_html_state *s)
{
	char *sp, buffer[32];
	const char *pc;
	int old_len, n;

	/* do replacements */
	sp = args->p;
	old_len = args->len;
	args->len = 0;
	s->start = sp;
	while (sp < args->p + old_len) {

		if (args->len + 7 >= args->max_len) {
			lwsl_err("Used up interpret padding\n");
			return -1;
		}

		if ((!s->pos && *sp == '$') || s->pos) {
			int hits = 0, hit = 0;

			if (!s->pos)
				s->start = sp;
			s->swallow[s->pos++] = *sp;
			if (s->pos == sizeof(s->swallow) - 1)
				goto skip;
			for (n = 0; n < s->count_vars; n++)
				if (!strncmp(s->swallow, s->vars[n], (unsigned int)s->pos)) {
					hits++;
					hit = n;
				}
			if (!hits) {
skip:
				s->swallow[s->pos] = '\0';
				memcpy(s->start, s->swallow, (unsigned int)s->pos);
				args->len++;
				s->pos = 0;
				sp = s->start + 1;
				continue;
			}
			if (hits == 1 && s->pos == (int)strlen(s->vars[hit])) {
				pc = s->replace(s->data, hit);
				if (!pc)
					pc = "NULL";
				n = (int)strlen(pc);
				s->swallow[s->pos] = '\0';
				if (n != s->pos) {
					memmove(s->start + n, s->start + s->pos,
						(unsigned int)(old_len - (sp - args->p) - 1));
					old_len += (n - s->pos) + 1;
				}
				memcpy(s->start, pc, (unsigned int)n);
				args->len++;
				sp = s->start + 1;

				s->pos = 0;
			}
			sp++;
			continue;
		}

		args->len++;
		sp++;
	}

	if (args->chunked) {
		/* no space left for final chunk trailer */
		if (args->final && args->len + 7 >= args->max_len)
			return -1;

		n = sprintf(buffer, "%X\x0d\x0a", args->len);

		args->p -= n;
		memcpy(args->p, buffer, (unsigned int)n);
		args->len += n;

		if (args->final) {
			sp = args->p + args->len;
			*sp++ = '\x0d';
			*sp++ = '\x0a';
			*sp++ = '0';
			*sp++ = '\x0d';
			*sp++ = '\x0a';
			*sp++ = '\x0d';
			*sp++ = '\x0a';
			args->len += 7;
		} else {
			sp = args->p + args->len;
			*sp++ = '\x0d';
			*sp++ = '\x0a';
			args->len += 2;
		}
	}

	return 0;
}